

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

vm_lookup_ext * vm_lookup_ext::alloc_ext(CVmObjLookupTable *self,uint bucket_cnt,uint value_cnt)

{
  int iVar1;
  undefined4 extraout_var;
  vm_lookup_ext *pvVar2;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,(ulong)value_cnt * 0x28 + (ulong)(bucket_cnt - 1) * 8 + 0x28,
                     self);
  pvVar2 = (vm_lookup_ext *)CONCAT44(extraout_var,iVar1);
  pvVar2->bucket_cnt = bucket_cnt;
  pvVar2->value_cnt = value_cnt;
  (pvVar2->default_value).typ = VM_NIL;
  return pvVar2;
}

Assistant:

vm_lookup_ext *vm_lookup_ext::alloc_ext(VMG_ CVmObjLookupTable *self,
                                        uint bucket_cnt, uint value_cnt)
{
    size_t siz;
    vm_lookup_ext *ext;

    /* calculate how much space we need */
    siz = sizeof(vm_lookup_ext)
          + (bucket_cnt - 1) * sizeof(ext->buckets[0])
          + value_cnt * sizeof(vm_lookup_val);

    /* allocate the memory */
    ext = (vm_lookup_ext *)G_mem->get_var_heap()->alloc_mem(siz, self);

    /* remember the table sizes */
    ext->bucket_cnt = bucket_cnt;
    ext->value_cnt = value_cnt;

    /* set the default value to nil initially */
    ext->default_value.set_nil();

    /* return the new extension */
    return ext;
}